

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_split_tet(REF_SUBDIV ref_subdiv)

{
  REF_INT *pRVar1;
  REF_INT RVar2;
  uint uVar3;
  REF_INT RVar4;
  REF_STATUS RVar5;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_INT nst_5;
  REF_INT nst_4;
  REF_INT nst_3;
  REF_INT nst_2;
  REF_INT nst_1;
  REF_INT nst;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_DBL volume;
  REF_INT local_180;
  REF_INT node;
  REF_INT e5;
  REF_INT e4;
  REF_INT e3;
  REF_INT e2;
  REF_INT e1;
  REF_INT e0;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT global_edge;
  REF_INT split_edge;
  REF_INT edge;
  REF_INT map;
  REF_INT *marked_for_removal;
  uint local_138;
  REF_INT new_cell;
  REF_INT new_nodes [27];
  REF_INT local_c4;
  REF_INT nodes [27];
  REF_CELL local_50;
  REF_CELL ref_cell_split;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_SUBDIV pRStack_30;
  REF_INT cell;
  REF_SUBDIV ref_subdiv_local;
  
  ref_cell = (REF_CELL)ref_subdiv->grid->node;
  ref_cell_split = ref_subdiv->grid->cell[8];
  pRStack_30 = ref_subdiv;
  if (ref_cell_split->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x670,
           "ref_subdiv_split_tet","malloc marked_for_removal of REF_INT negative");
    ref_subdiv_local._4_4_ = 1;
  }
  else {
    _edge = malloc((long)ref_cell_split->max << 2);
    if (_edge == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x670,"ref_subdiv_split_tet","malloc marked_for_removal of REF_INT NULL");
      ref_subdiv_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_cell_split->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)_edge + (long)ref_private_macro_code_rss_1 * 4) = 0;
      }
      uVar3 = ref_cell_create(&local_50,ref_cell_split->type);
      if (uVar3 == 0) {
        for (ref_node._4_4_ = 0; RVar4 = local_c4, (int)ref_node._4_4_ < ref_cell_split->max;
            ref_node._4_4_ = ref_node._4_4_ + 1) {
          if (((-1 < (int)ref_node._4_4_) && ((int)ref_node._4_4_ < ref_cell_split->max)) &&
             (ref_cell_split->c2n[(int)(ref_cell_split->size_per * ref_node._4_4_)] != -1)) {
            split_edge = ref_subdiv_map(pRStack_30,ref_cell_split,ref_node._4_4_);
            uVar3 = ref_cell_nodes(ref_cell_split,ref_node._4_4_,new_nodes + 0x1a);
            RVar2 = new_nodes[0x1a];
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x675,"ref_subdiv_split_tet",(ulong)uVar3,"nodes");
              return uVar3;
            }
            switch(split_edge) {
            case 0:
              break;
            case 1:
            case 2:
            case 4:
            case 8:
            case 0x10:
            case 0x20:
              n0 = -1;
              for (global_edge = 0; global_edge < ref_cell_split->edge_per;
                  global_edge = global_edge + 1) {
                pRVar1 = pRStack_30->mark;
                RVar4 = ref_subdiv_c2e(pRStack_30,ref_cell_split,global_edge,ref_node._4_4_);
                if (pRVar1[RVar4] != 0) {
                  n0 = global_edge;
                }
              }
              if (n0 == -1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x684,"ref_subdiv_split_tet","edge not found");
                return 1;
              }
              n1 = ref_subdiv_c2e(pRStack_30,ref_cell_split,n0,ref_node._4_4_);
              *(undefined4 *)((long)_edge + (long)(int)ref_node._4_4_ * 4) = 1;
              for (volume._4_4_ = 0; volume._4_4_ < 4; volume._4_4_ = volume._4_4_ + 1) {
                (&local_138)[volume._4_4_] = new_nodes[(long)volume._4_4_ + 0x1a];
              }
              (&local_138)[ref_cell_split->e2n[n0 << 1]] = pRStack_30->node[n1];
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x68c,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              for (volume._4_4_ = 0; volume._4_4_ < 4; volume._4_4_ = volume._4_4_ + 1) {
                (&local_138)[volume._4_4_] = new_nodes[(long)volume._4_4_ + 0x1a];
              }
              (&local_138)[ref_cell_split->e2n[n0 * 2 + 1]] = pRStack_30->node[n1];
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x691,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              break;
            default:
              uVar3 = ref_subdiv_map_to_edge(split_edge);
              if (uVar3 == 0) {
                printf("tet %d, map %d\n",(ulong)ref_node._4_4_,(ulong)(uint)split_edge);
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6fb,"ref_subdiv_split_tet",6,"map not implemented yet");
                return 6;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x6f9,"ref_subdiv_split_tet",(ulong)uVar3,"map2edge");
              return uVar3;
            case 0xb:
            case 0x15:
            case 0x26:
            case 0x38:
              *(undefined4 *)((long)_edge + (long)(int)ref_node._4_4_ * 4) = 1;
              if (split_edge == 0x38) {
                new_nodes[0x1a] = nodes[1];
                nodes[1] = RVar2;
                local_c4 = nodes[0];
                nodes[0] = RVar4;
              }
              RVar2 = local_c4;
              RVar4 = new_nodes[0x1a];
              if (split_edge == 0x26) {
                local_c4 = nodes[1];
                nodes[1] = RVar2;
                new_nodes[0x1a] = nodes[0];
                nodes[0] = RVar4;
              }
              RVar2 = nodes[0];
              RVar4 = new_nodes[0x1a];
              if (split_edge == 0x15) {
                nodes[0] = nodes[1];
                nodes[1] = RVar2;
                new_nodes[0x1a] = local_c4;
                local_c4 = RVar4;
              }
              for (volume._4_4_ = 0; volume._4_4_ < 4; volume._4_4_ = volume._4_4_ + 1) {
                (&local_138)[volume._4_4_] = new_nodes[(long)volume._4_4_ + 0x1a];
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,new_nodes[0x1a],local_c4,&new_cell);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ad,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,new_nodes[0x1a],nodes[0],new_nodes);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6b0,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6b1,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              for (volume._4_4_ = 0; volume._4_4_ < 4; volume._4_4_ = volume._4_4_ + 1) {
                (&local_138)[volume._4_4_] = new_nodes[(long)volume._4_4_ + 0x1a];
              }
              uVar3 = ref_subdiv_node_between
                                (pRStack_30,local_c4,new_nodes[0x1a],(REF_INT *)&local_138);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6b7,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,local_c4,nodes[0],new_nodes);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ba,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6bb,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              for (volume._4_4_ = 0; volume._4_4_ < 4; volume._4_4_ = volume._4_4_ + 1) {
                (&local_138)[volume._4_4_] = new_nodes[(long)volume._4_4_ + 0x1a];
              }
              uVar3 = ref_subdiv_node_between
                                (pRStack_30,nodes[0],new_nodes[0x1a],(REF_INT *)&local_138);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6c1,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,nodes[0],local_c4,&new_cell);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6c4,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6c5,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              for (volume._4_4_ = 0; volume._4_4_ < 4; volume._4_4_ = volume._4_4_ + 1) {
                (&local_138)[volume._4_4_] = new_nodes[(long)volume._4_4_ + 0x1a];
              }
              uVar3 = ref_subdiv_node_between
                                (pRStack_30,new_nodes[0x1a],local_c4,(REF_INT *)&local_138);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6cb,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,local_c4,nodes[0],&new_cell);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ce,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,nodes[0],new_nodes[0x1a],new_nodes);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6d1,"ref_subdiv_split_tet",(ulong)uVar3,"mis");
                return uVar3;
              }
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6d2,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              break;
            case 0x3f:
              *(undefined4 *)((long)_edge + (long)(int)ref_node._4_4_ * 4) = 1;
              n2 = new_nodes[0x1a];
              n3 = local_c4;
              e0 = nodes[0];
              e1 = nodes[1];
              uVar3 = ref_subdiv_node_between(pRStack_30,new_nodes[0x1a],local_c4,&e2);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6e9,"ref_subdiv_split_tet",(ulong)uVar3,"e");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,new_nodes[0x1a],nodes[0],&e3);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ea,"ref_subdiv_split_tet",(ulong)uVar3,"e");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,new_nodes[0x1a],nodes[1],&e4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6eb,"ref_subdiv_split_tet",(ulong)uVar3,"e");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,local_c4,nodes[0],&e5);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ec,"ref_subdiv_split_tet",(ulong)uVar3,"e");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,local_c4,nodes[1],&node);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ed,"ref_subdiv_split_tet",(ulong)uVar3,"e");
                return uVar3;
              }
              uVar3 = ref_subdiv_node_between(pRStack_30,nodes[0],nodes[1],&local_180);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ee,"ref_subdiv_split_tet",(ulong)uVar3,"e");
                return uVar3;
              }
              local_138 = e2;
              new_cell = e4;
              new_nodes[0] = e3;
              new_nodes[1] = n2;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ef,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6ef,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
              local_138 = e2;
              new_cell = e5;
              new_nodes[0] = node;
              new_nodes[1] = n3;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f0,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f0,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
              local_138 = e3;
              new_cell = local_180;
              new_nodes[0] = e5;
              new_nodes[1] = e0;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f1,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f1,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
              local_138 = e4;
              new_cell = node;
              new_nodes[0] = local_180;
              new_nodes[1] = e1;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f2,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f2,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
              local_138 = e2;
              new_cell = local_180;
              new_nodes[0] = e3;
              new_nodes[1] = e4;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f3,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f3,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
              local_138 = e2;
              new_cell = local_180;
              new_nodes[0] = e4;
              new_nodes[1] = node;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f4,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f4,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
              local_138 = e2;
              new_cell = local_180;
              new_nodes[0] = node;
              new_nodes[1] = e5;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f5,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f5,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
              local_138 = e2;
              new_cell = local_180;
              new_nodes[0] = e5;
              new_nodes[1] = e3;
              uVar3 = ref_cell_add(local_50,(REF_INT *)&local_138,
                                   (REF_INT *)((long)&marked_for_removal + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f6,"ref_subdiv_split_tet",(ulong)uVar3,"add");
                return uVar3;
              }
              uVar3 = ref_node_tet_vol((REF_NODE)ref_cell,(REF_INT *)&local_138,
                                       (REF_DBL *)&ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                       ,0x6f6,"ref_subdiv_split_tet",(ulong)uVar3,"edge split vol");
                return uVar3;
              }
              if (_ref_private_macro_code_rss < *(double *)&ref_cell[1].blank) {
                printf("%d cell %d map %d: %d(%d) %d(%d) %d(%d) %d(%d) vol %e\n",
                       _ref_private_macro_code_rss,(ulong)ref_node._4_4_,(ulong)(uint)split_edge,
                       (ulong)*(uint *)(*(long *)&ref_cell[1].size_per + 4),(ulong)local_138,
                       (ulong)*(uint *)(*(long *)&ref_cell->n + (long)(int)local_138 * 4),new_cell,
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_cell * 4),new_nodes[0],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[0] * 4),new_nodes[1],
                       *(undefined4 *)(*(long *)&ref_cell->n + (long)new_nodes[1] * 4));
                ref_node_location((REF_NODE)ref_cell,local_138);
                ref_node_location((REF_NODE)ref_cell,new_cell);
                ref_node_location((REF_NODE)ref_cell,new_nodes[0]);
                ref_node_location((REF_NODE)ref_cell,new_nodes[1]);
              }
            }
          }
        }
        for (ref_node._4_4_ = 0; (int)ref_node._4_4_ < ref_cell_split->max;
            ref_node._4_4_ = ref_node._4_4_ + 1) {
          if ((*(int *)((long)_edge + (long)(int)ref_node._4_4_ * 4) == 1) &&
             (uVar3 = ref_cell_remove(ref_cell_split,ref_node._4_4_), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x701,"ref_subdiv_split_tet",(ulong)uVar3,"remove");
            return uVar3;
          }
        }
        for (ref_node._4_4_ = 0; (int)ref_node._4_4_ < local_50->max;
            ref_node._4_4_ = ref_node._4_4_ + 1) {
          RVar5 = ref_cell_nodes(local_50,ref_node._4_4_,new_nodes + 0x1a);
          if ((RVar5 == 0) &&
             (uVar3 = ref_subdiv_add_local_cell(pRStack_30,ref_cell_split,new_nodes + 0x1a),
             uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x704,"ref_subdiv_split_tet",(ulong)uVar3,"add local");
            return uVar3;
          }
        }
        uVar3 = ref_cell_free(local_50);
        if (uVar3 == 0) {
          free(_edge);
          ref_subdiv_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x706,"ref_subdiv_split_tet",(ulong)uVar3,"temp ref_cell free");
          ref_subdiv_local._4_4_ = uVar3;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x672,"ref_subdiv_split_tet",(ulong)uVar3,"temp cell");
        ref_subdiv_local._4_4_ = uVar3;
      }
    }
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_tet(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;

  REF_INT edge, split_edge, global_edge;
  REF_INT n0, n1, n2, n3;
  REF_INT e0, e1, e2, e3, e4, e5;

  REF_INT node;
  REF_DBL volume;

  ref_cell = ref_grid_tet(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 1:
      case 2:
      case 4:
      case 8:
      case 16:
      case 32:
        split_edge = REF_EMPTY;
        for (edge = 0; edge < ref_cell_edge_per(ref_cell); edge++)
          if (ref_subdiv_mark(ref_subdiv,
                              ref_subdiv_c2e(ref_subdiv, ref_cell, edge, cell)))
            split_edge = edge;
        RAS(REF_EMPTY != split_edge, "edge not found");
        global_edge = ref_subdiv_c2e(ref_subdiv, ref_cell, split_edge, cell);

        marked_for_removal[cell] = 1;

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 0, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        new_nodes[ref_cell_e2n_gen(ref_cell, 1, split_edge)] =
            ref_subdiv_node(ref_subdiv, global_edge);
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      case 11:
      case 56:
      case 38:
      case 21:
        /* orient cell for other cases */

        marked_for_removal[cell] = 1;

        if (56 == map) {
          node_swap(nodes, 0, 3);
          node_swap(nodes, 1, 2);
        }
        if (38 == map) {
          node_swap(nodes, 1, 3);
          node_swap(nodes, 0, 2);
        }
        if (21 == map) {
          node_swap(nodes, 2, 3);
          node_swap(nodes, 0, 1);
        }

        /* near node 0 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near node 1 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near node 2 */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* center */
        for (node = 0; node < 4; node++) new_nodes[node] = nodes[node];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      /*
                          inode3------5------inode2
                             / \              . /
                            /   \          .   /
                           /     \      .     /
                          /       \  .       /
                         /        .\        /
                        2      1    4      3
                       /    .        \    /
                      /  .            \  /
                     /.                \/
                  inode0------0------inode1
       */
      case 63:
        marked_for_removal[cell] = 1;

        n0 = nodes[0];
        n1 = nodes[1];
        n2 = nodes[2];
        n3 = nodes[3];
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1], &e0), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2], &e1), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3], &e2), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2], &e3), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[3], &e4), "e");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[3], &e5), "e");
        add_cell_with(e0, e2, e1, n0);
        add_cell_with(e0, e3, e4, n1);
        add_cell_with(e1, e5, e3, n2);
        add_cell_with(e2, e4, e5, n3);
        add_cell_with(e0, e5, e1, e2);
        add_cell_with(e0, e5, e2, e4);
        add_cell_with(e0, e5, e4, e3);
        add_cell_with(e0, e5, e3, e1);
        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("tet %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}